

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pitch_mark.cc
# Opt level: O2

int main(int argc,char **argv)

{
  double data_to_write;
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  double *pdVar8;
  long lVar9;
  vector<double,_std::allocator<double>_> *f0_00;
  long lVar10;
  int iVar11;
  ostringstream *this;
  ulong uVar12;
  int iVar13;
  long lVar14;
  char *pcVar15;
  double dVar16;
  allocator local_4a9;
  int tmp;
  double local_488;
  ulong local_480;
  double upper_f0;
  double lower_f0;
  double sampling_rate;
  Polarity polarity;
  vector<double,_std::allocator<double>_> waveform;
  PitchExtraction pitch_extraction;
  vector<double,_std::allocator<double>_> pitch_mark;
  double unvoiced_value;
  double voicing_threshold;
  long local_3f0;
  ulong local_3e8;
  long local_3e0;
  double local_3d8;
  ostringstream error_message_10;
  vector<double,_std::allocator<double>_> f0;
  ifstream ifs;
  byte abStack_218 [488];
  
  sampling_rate = 16.0;
  lower_f0 = 60.0;
  upper_f0 = 240.0;
  voicing_threshold = 0.9;
  unvoiced_value = 0.0;
  local_480 = 0;
  do {
    iVar4 = ya_getopt_long(argc,argv,"s:L:H:t:o:u:h",(option *)0x0,(int *)0x0);
    switch(iVar4) {
    case 0x6f:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToInteger((string *)&ifs,&tmp);
      if (bVar2) {
        bVar2 = sptk::IsInRange(tmp,0,5);
        std::__cxx11::string::~string((string *)&ifs);
        if (bVar2) {
          local_480 = (ulong)(uint)tmp;
          break;
        }
      }
      else {
        std::__cxx11::string::~string((string *)&ifs);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -o option must be an integer ")
      ;
      poVar7 = std::operator<<(poVar7,"in the range of ");
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,0);
      poVar7 = std::operator<<(poVar7," to ");
      std::ostream::operator<<((ostream *)poVar7,5);
      std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&waveform);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103f39;
    case 0x70:
    case 0x71:
    case 0x72:
switchD_001039ca_caseD_70:
      anon_unknown.dwarf_2e7f::PrintUsage((ostream *)&std::cerr);
      return 1;
    case 0x73:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&sampling_rate);
      if (!bVar2 || sampling_rate <= 6.0) {
        std::__cxx11::string::~string((string *)&ifs);
      }
      else {
        local_488 = sampling_rate;
        std::__cxx11::string::~string((string *)&ifs);
        if (local_488 <= 98.0) break;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar7 = std::operator<<((ostream *)&ifs,"The argument for the -s option must be a number ");
      std::operator<<(poVar7,"in the interval (");
      poVar7 = std::ostream::_M_insert<double>(6.0);
      std::operator<<(poVar7,", ");
      poVar7 = std::ostream::_M_insert<double>(98.0);
      std::operator<<(poVar7,"]");
      std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp);
      sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
      goto LAB_00103f39;
    case 0x74:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&voicing_threshold);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -t option must be numeric");
        std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_00103f39;
      }
      break;
    case 0x75:
      std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
      bVar2 = sptk::ConvertStringToDouble((string *)&ifs,&unvoiced_value);
      std::__cxx11::string::~string((string *)&ifs);
      if (!bVar2) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"The argument for the -u option must be a number");
        std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp);
        sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
        goto LAB_00103f39;
      }
      break;
    default:
      if (iVar4 == 0x48) {
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
        bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&upper_f0);
        bVar2 = upper_f0 <= 0.0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          std::operator<<((ostream *)&ifs,"The argument for the -H option must be a positive number"
                         );
          std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp);
          sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
LAB_00103f39:
          std::__cxx11::string::~string((string *)&error_message_10);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
          return 1;
        }
      }
      else {
        if (iVar4 != 0x4c) {
          if (iVar4 != -1) {
            if (iVar4 == 0x68) {
              anon_unknown.dwarf_2e7f::PrintUsage((ostream *)&std::cout);
              return 0;
            }
            goto switchD_001039ca_caseD_70;
          }
          if (sampling_rate * 1000.0 * 0.5 <= upper_f0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,
                            "Upper fundamental frequency must be less than Nyquist frequency");
            std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp)
            ;
            sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          }
          else if (upper_f0 <= lower_f0) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,
                            "Lower fundamental frequency must be less than upper one");
            std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp)
            ;
            sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          }
          else if (argc - ya_optind < 2) {
            if (argc == ya_optind) {
              pcVar15 = (char *)0x0;
            }
            else {
              pcVar15 = argv[ya_optind];
            }
            local_488 = sampling_rate * 1000.0;
            bVar2 = sptk::SetBinaryMode();
            this = (ostringstream *)&ifs;
            if (bVar2) {
              std::ifstream::ifstream(this);
              if ((pcVar15 == (char *)0x0) ||
                 (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar15),
                 (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
                cVar3 = std::__basic_file<char>::is_open();
                if (cVar3 == '\0') {
                  this = (ostringstream *)&std::cin;
                }
                iVar4 = 1;
                sptk::PitchExtraction::PitchExtraction
                          (&pitch_extraction,1,local_488,lower_f0,upper_f0,voicing_threshold,kReaper
                          );
                if ((pitch_extraction.pitch_extraction_ == (PitchExtractionInterface *)0x0) ||
                   (iVar5 = (*(pitch_extraction.pitch_extraction_)->_vptr_PitchExtractionInterface
                              [2])(), (char)iVar5 == '\0')) {
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
                  std::operator<<((ostream *)&error_message_10,
                                  "Failed to initialize PitchExtraction");
                  std::__cxx11::string::string((string *)&tmp,"pitch_mark",(allocator *)&waveform);
                  sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                  std::__cxx11::string::~string((string *)&tmp);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
                  iVar5 = 1;
                }
                else {
                  waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = (pointer)0x0;
                  waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)0x0;
                  waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                  while (bVar2 = sptk::ReadStream<double>
                                           ((double *)&error_message_10,(istream *)this), bVar2) {
                    std::vector<double,_std::allocator<double>_>::push_back
                              (&waveform,(value_type *)&error_message_10);
                  }
                  if (waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      waveform.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish) {
                    iVar5 = 0;
                  }
                  else {
                    f0_00 = &f0;
                    if ((uint)local_480 == 2) {
                      f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
                    }
                    if ((uint)local_480 < 2) {
                      f0_00 = (vector<double,_std::allocator<double>_> *)0x0;
                    }
                    f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    pitch_mark.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start = (pointer)0x0;
                    pitch_mark.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish = (pointer)0x0;
                    pitch_mark.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                    bVar2 = sptk::PitchExtraction::Run
                                      (&pitch_extraction,&waveform,f0_00,&pitch_mark,&polarity);
                    iVar5 = iVar4;
                    if (bVar2) {
                      pdVar8 = pitch_mark.super__Vector_base<double,_std::allocator<double>_>.
                               _M_impl.super__Vector_impl_data._M_start;
                      if ((uint)local_480 != 1) {
                        for (; pdVar8 != pitch_mark.
                                         super__Vector_base<double,_std::allocator<double>_>._M_impl
                                         .super__Vector_impl_data._M_finish; pdVar8 = pdVar8 + 1) {
                          *pdVar8 = *pdVar8 * local_488;
                        }
                      }
                      if (polarity == kUnknown) {
                        std::__cxx11::ostringstream::ostringstream
                                  ((ostringstream *)&error_message_10);
                        std::operator<<((ostream *)&error_message_10,"Failed to detect polarity");
                        std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                        sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                        goto LAB_001046c5;
                      }
                      data_to_write =
                           *(double *)(&DAT_00125070 + (ulong)(polarity == kPositive) * 8);
                      uVar12 = (ulong)((long)waveform.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                      (long)waveform.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start) >> 3;
                      iVar6 = (int)((ulong)((long)pitch_mark.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pitch_mark.
                                                 super__Vector_base<double,_std::allocator<double>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
                      if ((uint)local_480 - 3 < 3) {
                        local_3f0 = (long)iVar6;
                        lVar9 = 0;
                        iVar6 = 0;
                        local_3e8 = uVar12;
                        while (lVar9 <= local_3f0) {
                          iVar11 = (int)local_3e8;
                          if (lVar9 < local_3f0) {
                            dVar16 = round(pitch_mark.
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_start[lVar9]);
                            iVar11 = (int)dVar16;
                          }
                          lVar14 = (long)iVar6;
                          lVar10 = lVar14;
                          iVar13 = iVar6;
                          if (iVar6 < iVar11) {
                            iVar13 = iVar11;
                          }
                          for (; lVar10 < iVar11; lVar10 = lVar10 + 1) {
                            if ((f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar10] == 0.0) &&
                               (!NAN(f0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                     super__Vector_impl_data._M_start[lVar10]))) {
                              iVar13 = (int)lVar10;
                              break;
                            }
                          }
                          local_3e0 = lVar9;
                          if (iVar6 < iVar13) {
                            local_3d8 = 0.0;
                            for (lVar9 = lVar14 * 8; (long)iVar13 * 8 - lVar9 != 0;
                                lVar9 = lVar9 + 8) {
                              local_3d8 = local_3d8 +
                                          *(double *)
                                           ((long)f0.
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start + lVar9)
                              ;
                            }
                            local_3d8 = 6.283185307179586 / local_3d8;
                            dVar16 = 0.0;
                            for (; lVar14 < iVar13; lVar14 = lVar14 + 1) {
                              iVar6 = (int)local_480;
                              local_488 = dVar16;
                              if (iVar6 == 5) {
                                dVar16 = fmod(dVar16,6.283185307179586);
                                dVar16 = dVar16 / 3.141592653589793 + -1.0;
                              }
                              else if (iVar6 == 4) {
                                dVar16 = cos(dVar16);
                              }
                              else {
                                if (iVar6 != 3) goto LAB_001046df;
                                dVar16 = sin(dVar16);
                              }
                              bVar2 = sptk::WriteStream<double>
                                                (dVar16 * data_to_write,(ostream *)&std::cout);
                              if (!bVar2) {
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)&error_message_10);
                                std::operator<<((ostream *)&error_message_10,
                                                "Failed to write periodic sequence");
                                std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9)
                                ;
                                sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                                goto LAB_001046c5;
                              }
                              dVar16 = local_488 +
                                       f0.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_start[lVar14] * local_3d8;
                            }
                          }
                          iVar13 = iVar13 + -1;
                          while (iVar13 = iVar13 + 1, iVar13 < iVar11) {
                            bVar2 = sptk::WriteStream<double>(unvoiced_value,(ostream *)&std::cout);
                            if (!bVar2) {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&error_message_10);
                              std::operator<<((ostream *)&error_message_10,
                                              "Failed to write periodic sequence");
                              std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                              sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                              goto LAB_001046c5;
                            }
                          }
                          iVar6 = iVar11;
                          lVar9 = local_3e0 + 1;
                        }
LAB_001047ad:
                        iVar5 = 0;
                      }
                      else if ((uint)local_480 - 1 < 2) {
                        if (iVar6 < 1) goto LAB_001047ad;
                        bVar2 = sptk::WriteStream<double>
                                          (0,iVar6,&pitch_mark,(ostream *)&std::cout,(int *)0x0);
                        iVar5 = 0;
                        if (!bVar2) {
                          std::__cxx11::ostringstream::ostringstream
                                    ((ostringstream *)&error_message_10);
                          std::operator<<((ostream *)&error_message_10,"Failed to write pitch mark")
                          ;
                          std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                          sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                          goto LAB_001046c5;
                        }
                      }
                      else if ((uint)local_480 == 0) {
                        if (pitch_mark.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start ==
                            pitch_mark.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish) {
                          iVar4 = -1;
                        }
                        else {
                          dVar16 = round(*pitch_mark.
                                          super__Vector_base<double,_std::allocator<double>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
                          iVar4 = (int)dVar16;
                        }
                        iVar5 = (int)uVar12;
                        if (iVar5 < 1) {
                          iVar5 = 0;
                        }
                        iVar11 = 1;
                        iVar13 = 0;
                        do {
                          if (iVar5 == iVar13) goto LAB_001047ad;
                          if (iVar13 == iVar4) {
                            bVar2 = sptk::WriteStream<double>(data_to_write,(ostream *)&std::cout);
                            if (!bVar2) {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&error_message_10);
                              std::operator<<((ostream *)&error_message_10,
                                              "Failed to write pitch mark");
                              std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                              sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
LAB_00104849:
                              std::__cxx11::string::~string((string *)&tmp);
                              std::__cxx11::ostringstream::~ostringstream
                                        ((ostringstream *)&error_message_10);
                              iVar5 = 1;
                              break;
                            }
                            if (iVar11 < iVar6) {
                              lVar9 = (long)iVar11;
                              iVar11 = iVar11 + 1;
                              dVar16 = round(pitch_mark.
                                             super__Vector_base<double,_std::allocator<double>_>.
                                             _M_impl.super__Vector_impl_data._M_start[lVar9]);
                              iVar4 = (int)dVar16;
                            }
                          }
                          else {
                            bVar2 = sptk::WriteStream<double>(0.0,(ostream *)&std::cout);
                            if (!bVar2) {
                              std::__cxx11::ostringstream::ostringstream
                                        ((ostringstream *)&error_message_10);
                              std::operator<<((ostream *)&error_message_10,
                                              "Failed to write pitch mark");
                              std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                              sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                              goto LAB_00104849;
                            }
                          }
                          iVar13 = iVar13 + 1;
                        } while( true );
                      }
                    }
                    else {
                      std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10)
                      ;
                      std::operator<<((ostream *)&error_message_10,"Failed to extract pitch mark");
                      std::__cxx11::string::string((string *)&tmp,"pitch_mark",&local_4a9);
                      sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
LAB_001046c5:
                      std::__cxx11::string::~string((string *)&tmp);
                      std::__cxx11::ostringstream::~ostringstream
                                ((ostringstream *)&error_message_10);
                      iVar5 = iVar4;
                    }
LAB_001046df:
                    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                              (&pitch_mark.super__Vector_base<double,_std::allocator<double>_>);
                    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                              (&f0.super__Vector_base<double,_std::allocator<double>_>);
                  }
                  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                            (&waveform.super__Vector_base<double,_std::allocator<double>_>);
                }
                pitch_extraction._vptr_PitchExtraction =
                     (_func_int **)&PTR__PitchExtraction_00131a38;
                if (pitch_extraction.pitch_extraction_ != (PitchExtractionInterface *)0x0) {
                  (*(pitch_extraction.pitch_extraction_)->_vptr_PitchExtractionInterface[1])();
                }
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_10);
                poVar7 = std::operator<<((ostream *)&error_message_10,"Cannot open file ");
                std::operator<<(poVar7,pcVar15);
                std::__cxx11::string::string((string *)&tmp,"pitch_mark",(allocator *)&waveform);
                sptk::PrintErrorMessage((string *)&tmp,&error_message_10);
                std::__cxx11::string::~string((string *)&tmp);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_10);
                iVar5 = 1;
              }
              std::ifstream::~ifstream(&ifs);
              return iVar5;
            }
            std::__cxx11::ostringstream::ostringstream(this);
            std::operator<<((ostream *)this,"Cannot set translation mode");
            std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp)
            ;
            sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
            std::operator<<((ostream *)&ifs,"Too many input files");
            std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp)
            ;
            sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          }
          goto LAB_00103f39;
        }
        std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_10);
        bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&lower_f0);
        bVar2 = lower_f0 <= 10.0;
        std::__cxx11::string::~string((string *)&ifs);
        if (!bVar1 || bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
          poVar7 = std::operator<<((ostream *)&ifs,
                                   "The argument for the -L option must be a number ");
          std::operator<<(poVar7,"greater than 10");
          std::__cxx11::string::string((string *)&error_message_10,"pitch_mark",(allocator *)&tmp);
          sptk::PrintErrorMessage((string *)&error_message_10,(ostringstream *)&ifs);
          goto LAB_00103f39;
        }
      }
    }
  } while( true );
}

Assistant:

int main(int argc, char* argv[]) {
  double sampling_rate(kDefaultSamplingRate);
  double lower_f0(kDefaultLowerF0);
  double upper_f0(kDefaultUpperF0);
  double voicing_threshold(kDefaultVoicingThreshold);
  OutputFormats output_format(kDefaultOutputFormat);
  double unvoiced_value(kDefaultUnvoicedValue);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "s:L:H:t:o:u:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 's': {
        const double min(6.0);
        const double max(98.0);
        if (!sptk::ConvertStringToDouble(optarg, &sampling_rate) ||
            sampling_rate <= min || max < sampling_rate) {
          std::ostringstream error_message;
          error_message << "The argument for the -s option must be a number "
                        << "in the interval (" << min << ", " << max << "]";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'L': {
        if (!sptk::ConvertStringToDouble(optarg, &lower_f0) ||
            lower_f0 <= 10.0) {
          std::ostringstream error_message;
          error_message << "The argument for the -L option must be a number "
                        << "greater than 10";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'H': {
        if (!sptk::ConvertStringToDouble(optarg, &upper_f0) ||
            upper_f0 <= 0.0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -H option must be a positive number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 't': {
        if (!sptk::ConvertStringToDouble(optarg, &voicing_threshold)) {
          std::ostringstream error_message;
          error_message << "The argument for the -t option must be numeric";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'u': {
        if (!sptk::ConvertStringToDouble(optarg, &unvoiced_value)) {
          std::ostringstream error_message;
          error_message << "The argument for the -u option must be a number";
          sptk::PrintErrorMessage("pitch_mark", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const double sampling_rate_in_hz(1000.0 * sampling_rate);
  if (0.5 * sampling_rate_in_hz <= upper_f0) {
    std::ostringstream error_message;
    error_message
        << "Upper fundamental frequency must be less than Nyquist frequency";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (upper_f0 <= lower_f0) {
    std::ostringstream error_message;
    error_message << "Lower fundamental frequency must be less than upper one";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("pitch_mark", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::PitchExtraction pitch_extraction(
      1, sampling_rate_in_hz, lower_f0, upper_f0, voicing_threshold,
      sptk::PitchExtraction::Algorithms::kReaper);
  if (!pitch_extraction.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize PitchExtraction";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  std::vector<double> waveform;
  {
    double tmp;
    while (sptk::ReadStream(&tmp, &input_stream)) {
      waveform.push_back(tmp);
    }
  }
  if (waveform.empty()) return 0;

  const bool waveform_output(kBinarySequence != output_format &&
                             kPositionInSeconds != output_format &&
                             kPositionInSamples != output_format);
  std::vector<double> f0;
  std::vector<double> pitch_mark;
  sptk::PitchExtractionInterface::Polarity polarity;
  if (!pitch_extraction.Run(waveform, waveform_output ? &f0 : NULL, &pitch_mark,
                            &polarity)) {
    std::ostringstream error_message;
    error_message << "Failed to extract pitch mark";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }

  if (kPositionInSeconds != output_format) {
    std::transform(
        pitch_mark.begin(), pitch_mark.end(), pitch_mark.begin(),
        [sampling_rate_in_hz](double x) { return x * sampling_rate_in_hz; });
  }

  if (sptk::PitchExtractionInterface::Polarity::kUnknown == polarity) {
    std::ostringstream error_message;
    error_message << "Failed to detect polarity";
    sptk::PrintErrorMessage("pitch_mark", error_message);
    return 1;
  }
  const double binary_polarity(
      sptk::PitchExtractionInterface::Polarity::kPositive == polarity ? 1.0
                                                                      : -1.0);
  const int waveform_length(static_cast<int>(waveform.size()));
  const int num_pitch_marks(static_cast<int>(pitch_mark.size()));

  switch (output_format) {
    case kBinarySequence: {
      int next_pitch_mark(pitch_mark.empty()
                              ? -1
                              : static_cast<int>(std::round(pitch_mark[0])));
      for (int i(0), j(1); i < waveform_length; ++i) {
        if (i == next_pitch_mark) {
          if (!sptk::WriteStream(binary_polarity, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
          if (j < num_pitch_marks) {
            next_pitch_mark = static_cast<int>(std::round(pitch_mark[j++]));
          }
        } else {
          if (!sptk::WriteStream(0.0, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write pitch mark";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }
      }
      break;
    }
    case kPositionInSeconds:
    case kPositionInSamples: {
      if (0 < num_pitch_marks &&
          !sptk::WriteStream(0, num_pitch_marks, pitch_mark, &std::cout,
                             NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write pitch mark";
        sptk::PrintErrorMessage("pitch_mark", error_message);
        return 1;
      }
      break;
    }
    case kSine:
    case kCosine:
    case kSawtooth: {
      for (int n(0), i(0); n <= num_pitch_marks; ++n) {
        const int next_pitch_mark(
            n < num_pitch_marks ? static_cast<int>(std::round(pitch_mark[n]))
                                : waveform_length);
        // Find the point across voiced region to unvoiced one.
        int j(i);
        for (; j < next_pitch_mark; ++j) {
          if (0.0 == f0[j]) {
            break;
          }
        }

        // Output periodic sequence.
        if (i < j) {
          const double sum_f0(
              std::accumulate(f0.begin() + i, f0.begin() + j, 0.0));
          const double multiplier(sptk::kTwoPi / sum_f0);

          double phase(0.0);
          for (int k(i); k < j; ++k) {
            double value;
            switch (output_format) {
              case kSine: {
                value = std::sin(phase);
                break;
              }
              case kCosine: {
                value = std::cos(phase);
                break;
              }
              case kSawtooth: {
                value = std::fmod(phase, sptk::kTwoPi) / sptk::kPi - 1.0;
                break;
              }
              default: {
                return 1;
              }
            }
            if (!sptk::WriteStream(binary_polarity * value, &std::cout)) {
              std::ostringstream error_message;
              error_message << "Failed to write periodic sequence";
              sptk::PrintErrorMessage("pitch_mark", error_message);
              return 1;
            }
            phase += multiplier * f0[k];
          }
        }

        // Output unvoiced sequence.
        for (int k(j); k < next_pitch_mark; ++k) {
          if (!sptk::WriteStream(unvoiced_value, &std::cout)) {
            std::ostringstream error_message;
            error_message << "Failed to write periodic sequence";
            sptk::PrintErrorMessage("pitch_mark", error_message);
            return 1;
          }
        }

        i = next_pitch_mark;
      }
      break;
    }
    default: {
      return 1;
    }
  }

  return 0;
}